

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_handle_val_anchors_and_refs(Parser *this)

{
  pfn_error p_Var1;
  NodeType_e NVar2;
  code *pcVar3;
  Location LVar4;
  csubstr s;
  csubstr s_00;
  undefined8 uVar5;
  bool bVar6;
  undefined1 uVar7;
  State *pSVar8;
  size_t sVar9;
  NodeData *pNVar10;
  long lVar11;
  csubstr cVar12;
  csubstr rem;
  char msg [31];
  char *pcStack_28;
  size_t local_20;
  
  pSVar8 = this->m_state;
  if ((pSVar8->flags & 0x40) != 0) {
    builtin_strncpy(msg,"check failed: (!has_any(RKEY))",0x1f);
    if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      uVar7 = (*pcVar3)();
      return (bool)uVar7;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar12 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_20 = cVar12.len;
    pcStack_28 = cVar12.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x71a6) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x71a6) << 0x40,8);
    LVar4.name.str = pcStack_28;
    LVar4.name.len = local_20;
    (*p_Var1)(msg,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pSVar8 = this->m_state;
  }
  rem.str = (pSVar8->line_contents).rem.str;
  rem.len = (pSVar8->line_contents).rem.len;
  if (rem.len == 0) {
    return false;
  }
  if (*rem.str != '&') {
    if (*rem.str != '*') {
      return false;
    }
    bVar6 = is_debugger_attached();
    if ((bVar6) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      uVar7 = (*pcVar3)();
      return (bool)uVar7;
    }
    cVar12.len = 0x40;
    cVar12.str = "ERROR: not implemented - this should have been catched elsewhere";
    _err<>(this,cVar12);
    if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      uVar7 = (*pcVar3)();
      return (bool)uVar7;
    }
    handle_error(0x23f28d,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x71d9);
  }
  sVar9 = basic_substring<const_char>::first_of(&rem,' ',0);
  if ((sVar9 != 0xffffffffffffffff) && (rem.len < sVar9)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      uVar7 = (*pcVar3)();
      return (bool)uVar7;
    }
    handle_error(0x22b919,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1569,"pos <= len || pos == npos");
  }
  if (sVar9 == 0xffffffffffffffff) {
    msg._0_8_ = rem.str;
    msg._8_7_ = (undefined7)rem.len;
    msg[0xf] = (char)(rem.len >> 0x38);
  }
  else {
    basic_substring<const_char>::basic_substring((basic_substring<const_char> *)msg,rem.str,sVar9);
  }
  uVar5 = msg._0_8_;
  sVar9 = CONCAT17(msg[0xf],msg._8_7_);
  _line_progressed(this,sVar9);
  if (sVar9 == 0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      uVar7 = (*pcVar3)();
      return (bool)uVar7;
    }
    handle_error(0x22b919,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<const_char>::basic_substring
            ((basic_substring<const_char> *)msg,(char *)(uVar5 + 1),sVar9 - 1);
  uVar5 = msg._0_8_;
  sVar9 = CONCAT17(msg[0xf],msg._8_7_);
  if (((this->m_val_anchor).len != 0) && ((this->m_val_anchor).str != (char *)0x0)) {
    pNVar10 = Tree::_p(this->m_tree,this->m_state->node_id);
    if (((pNVar10->m_type).type & SEQ) == NOTYPE) {
      return true;
    }
    bVar6 = Tree::has_children(this->m_tree,this->m_state->node_id);
    if ((bVar6) ||
       (pNVar10 = Tree::_p(this->m_tree,this->m_state->node_id), NVar2 = (pNVar10->m_type).type,
       (NVar2 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar2 >> 9 & 1) != 0)) {
      (this->m_key_anchor).str = (char *)uVar5;
      (this->m_key_anchor).len = sVar9;
      s.len = rem.len;
      s.str = rem.str;
      sVar9 = LineContents::current_col(&this->m_state->line_contents,s);
      lVar11 = 0xa48;
      goto LAB_0020ac7d;
    }
    Tree::set_val_anchor(this->m_tree,this->m_state->node_id,this->m_val_anchor);
  }
  (this->m_val_anchor).str = (char *)uVar5;
  (this->m_val_anchor).len = sVar9;
  s_00.len = rem.len;
  s_00.str = rem.str;
  sVar9 = LineContents::current_col(&this->m_state->line_contents,s_00);
  lVar11 = 0xa60;
LAB_0020ac7d:
  *(size_t *)((long)(this->m_stack).m_buf + lVar11 + -0x38) = sVar9;
  return true;
}

Assistant:

bool Parser::_handle_val_anchors_and_refs()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, !has_any(RKEY));
    const csubstr rem = m_state->line_contents.rem;
    if(rem.begins_with('&'))
    {
        csubstr anchor = rem.left_of(rem.first_of(' '));
        _line_progressed(anchor.len);
        anchor = anchor.sub(1); // skip the first character
        _c4dbgpf("val: found an anchor: '{}', indentation={}!!!", anchor, m_state->line_contents.current_col(rem));
        if(m_val_anchor.empty())
        {
            _c4dbgpf("save val anchor: '{}'", anchor);
            m_val_anchor = anchor;
            m_val_anchor_indentation = m_state->line_contents.current_col(rem);
        }
        else
        {
            _c4dbgpf("there is a pending val anchor '{}'", m_val_anchor);
            if(m_tree->is_seq(m_state->node_id))
            {
                if(m_tree->has_children(m_state->node_id))
                {
                    _c4dbgpf("current node={} is a seq, has {} children", m_state->node_id, m_tree->num_children(m_state->node_id));
                    _c4dbgpf("... so take the new one as a key anchor '{}'", anchor);
                    m_key_anchor = anchor;
                    m_key_anchor_indentation = m_state->line_contents.current_col(rem);
                }
                else
                {
                    _c4dbgpf("current node={} is a seq, has no children", m_state->node_id);
                    if(m_tree->has_val_anchor(m_state->node_id))
                    {
                        _c4dbgpf("... node={} already has val anchor: '{}'", m_state->node_id, m_tree->val_anchor(m_state->node_id));
                        _c4dbgpf("... so take the new one as a key anchor '{}'", anchor);
                        m_key_anchor = anchor;
                        m_key_anchor_indentation = m_state->line_contents.current_col(rem);
                    }
                    else
                    {
                        _c4dbgpf("... so set pending val anchor: '{}' on current node {}", m_val_anchor, m_state->node_id);
                        m_tree->set_val_anchor(m_state->node_id, m_val_anchor);
                        m_val_anchor = anchor;
                        m_val_anchor_indentation = m_state->line_contents.current_col(rem);
                    }
                }
            }
        }
        return true;
    }
    else if(C4_UNLIKELY(rem.begins_with('*')))
    {
        _c4err("not implemented - this should have been catched elsewhere");
        C4_NEVER_REACH();
        return false;
    }
    return false;
}